

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O3

bool __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::processArg(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int *i,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args)

{
  string *val;
  pointer pbVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  
  if ((this->
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_Arg._alreadySet != false) {
    return false;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  val = pbVar1 + *i;
  uVar2 = pbVar1[*i]._M_string_length;
  if (uVar2 < 2) {
LAB_0011434c:
    ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    _extractValue(&this->
                   super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,val);
    (this->
    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super_Arg._alreadySet = true;
    bVar5 = true;
  }
  else {
    pcVar3 = (val->_M_dataplus)._M_p;
    if (pcVar3[1] != '\a') {
      uVar4 = 2;
      do {
        uVar6 = uVar4;
        if (uVar2 == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (pcVar3[uVar6] != '\a');
      if (uVar2 <= uVar6) goto LAB_0011434c;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool UnlabeledValueArg<T>::processArg(int *i, std::vector<std::string>& args) 
{
	
	if ( _alreadySet )
		return false;
	
	if ( _hasBlanks( args[*i] ) )
		return false;

	// never ignore an unlabeled arg
	
	_extractValue( args[*i] );
	_alreadySet = true;
	return true;
}